

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::zero(void)

{
  int iVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffa0;
  Numeral *in_stack_ffffffffffffffa8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffb0;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffc0;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffc8;
  
  if (Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p == '\0') {
    iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
    if (iVar1 != 0) {
      RationalConstantType::RationalConstantType
                (&in_stack_ffffffffffffffa0->numeral,in_stack_ffffffffffffff9c);
      MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomFactors
                (in_stack_ffffffffffffffc0);
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
                (in_stack_ffffffffffffffc8);
      Monom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
            (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             *)in_stack_ffffffffffffffa0);
      MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::~MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x379530);
      RationalConstantType::~RationalConstantType(&in_RDI->numeral);
      __cxa_atexit(~Monom,&zero::p,&__dso_handle);
      __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
    }
  }
  Monom(in_stack_ffffffffffffffa0,
        (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}